

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkSpecialUnits(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  precise_unit pVar5;
  string local_1e0;
  double local_1c0;
  double local_1b8;
  string local_1b0;
  double local_190;
  double local_188;
  precise_unit local_180;
  string local_170;
  double local_150;
  double local_148;
  precise_unit local_140;
  string local_130;
  double local_110;
  double local_108;
  string local_100;
  double local_e0;
  double local_d8;
  uint local_cc;
  string local_c8;
  double local_a8;
  double dStack_a0;
  string local_98 [8];
  string ustring;
  allocator local_61;
  string local_60;
  ulong local_40;
  size_t fnd;
  precise_unit bunit;
  uint64_t match_flags_local;
  string *unit_string_local;
  undefined8 local_10;
  
  bunit._8_8_ = match_flags;
  precise_unit::precise_unit((precise_unit *)&fnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"meter",&local_61);
  sVar3 = findWordOperatorSep(unit_string,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = sVar3;
  if (sVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::string(local_98,(string *)unit_string);
    std::__cxx11::string::erase((ulong)local_98,local_40);
    std::__cxx11::string::string((string *)&local_c8,local_98);
    pVar5 = unit_from_string_internal(&local_c8,bunit._8_8_);
    dStack_a0 = pVar5._8_8_;
    local_a8 = pVar5.multiplier_;
    fnd = (size_t)local_a8;
    bunit.multiplier_ = dStack_a0;
    std::__cxx11::string::~string((string *)&local_c8);
    bVar1 = is_valid((precise_unit *)&fnd);
    if (bVar1) {
      pVar5 = precise_unit::operator*((precise_unit *)&precise::m,(precise_unit *)&fnd);
      local_10 = pVar5._8_8_;
      unit_string_local = (string *)pVar5.multiplier_;
    }
    local_cc = (uint)bVar1;
    std::__cxx11::string::~string(local_98);
    if (local_cc != 0) goto LAB_001cb4a6;
  }
  iVar2 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x3);
  if (iVar2 == 0) {
    std::__cxx11::string::substr((ulong)&local_100,(ulong)unit_string);
    pVar5 = unit_from_string_internal(&local_100,bunit._8_8_ | 0x6000000000);
    local_d8 = pVar5._8_8_;
    local_e0 = pVar5.multiplier_;
    fnd = (size_t)local_e0;
    bunit.multiplier_ = local_d8;
    std::__cxx11::string::~string((string *)&local_100);
    bVar1 = is_valid((precise_unit *)&fnd);
    if (bVar1) {
      pVar5 = precise_unit::operator*((precise_unit *)&precise::A,(precise_unit *)&fnd);
      local_10 = pVar5._8_8_;
      unit_string_local = (string *)pVar5.multiplier_;
      goto LAB_001cb4a6;
    }
  }
  pcVar4 = (char *)std::__cxx11::string::front();
  if (*pcVar4 == '%') {
    if ((bunit._8_8_ & 0x8000000) == 0) {
      std::__cxx11::string::substr((ulong)&local_130,(ulong)unit_string);
      pVar5 = default_unit(&local_130);
      local_108 = pVar5._8_8_;
      local_110 = pVar5.multiplier_;
      fnd = (size_t)local_110;
      bunit.multiplier_ = local_108;
      std::__cxx11::string::~string((string *)&local_130);
      bVar1 = is_valid((precise_unit *)&fnd);
      if (bVar1) {
        pVar5 = precise_unit::operator*
                          ((precise_unit *)precise::percent,(precise_unit *)precise::pu);
        local_140._8_8_ = pVar5._8_8_;
        local_140.multiplier_ = pVar5.multiplier_;
        pVar5 = precise_unit::operator*(&local_140,(precise_unit *)&fnd);
        local_10 = pVar5._8_8_;
        unit_string_local = (string *)pVar5.multiplier_;
        goto LAB_001cb4a6;
      }
    }
    std::__cxx11::string::substr((ulong)&local_170,(ulong)unit_string);
    pVar5 = unit_from_string_internal(&local_170,bunit._8_8_ | 0x6000000000);
    local_148 = pVar5._8_8_;
    local_150 = pVar5.multiplier_;
    fnd = (size_t)local_150;
    bunit.multiplier_ = local_148;
    std::__cxx11::string::~string((string *)&local_170);
    bVar1 = is_valid((precise_unit *)&fnd);
    if (bVar1) {
      pVar5 = precise_unit::operator*((precise_unit *)precise::percent,(precise_unit *)precise::pu);
      local_180._8_8_ = pVar5._8_8_;
      local_180.multiplier_ = pVar5.multiplier_;
      pVar5 = precise_unit::operator*(&local_180,(precise_unit *)&fnd);
      local_10 = pVar5._8_8_;
      unit_string_local = (string *)pVar5.multiplier_;
      goto LAB_001cb4a6;
    }
  }
  iVar2 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x2);
  if (iVar2 == 0) {
    if ((bunit._8_8_ & 0x8000000) == 0) {
      std::__cxx11::string::substr((ulong)&local_1b0,(ulong)unit_string);
      pVar5 = default_unit(&local_1b0);
      local_188 = pVar5._8_8_;
      local_190 = pVar5.multiplier_;
      fnd = (size_t)local_190;
      bunit.multiplier_ = local_188;
      std::__cxx11::string::~string((string *)&local_1b0);
      bVar1 = is_valid((precise_unit *)&fnd);
      if (bVar1) {
        pVar5 = precise_unit::operator*((precise_unit *)precise::pu,(precise_unit *)&fnd);
        local_10 = pVar5._8_8_;
        unit_string_local = (string *)pVar5.multiplier_;
        goto LAB_001cb4a6;
      }
    }
    std::__cxx11::string::substr((ulong)&local_1e0,(ulong)unit_string);
    pVar5 = unit_from_string_internal(&local_1e0,bunit._8_8_ | 0x6000000000);
    local_1b8 = pVar5._8_8_;
    local_1c0 = pVar5.multiplier_;
    fnd = (size_t)local_1c0;
    bunit.multiplier_ = local_1b8;
    std::__cxx11::string::~string((string *)&local_1e0);
    bVar1 = is_valid((precise_unit *)&fnd);
    if (bVar1) {
      pVar5 = precise_unit::operator*((precise_unit *)precise::pu,(precise_unit *)&fnd);
      local_10 = pVar5._8_8_;
      unit_string_local = (string *)pVar5.multiplier_;
      goto LAB_001cb4a6;
    }
  }
  unit_string_local = (string *)0x7ff4000000000000;
  local_10 = 0xfa94a488;
LAB_001cb4a6:
  pVar5.base_units_ = (unit_data)(undefined4)local_10;
  pVar5.commodity_ = local_10._4_4_;
  pVar5.multiplier_ = (double)unit_string_local;
  return pVar5;
}

Assistant:

static precise_unit
    checkSpecialUnits(const std::string& unit_string, std::uint64_t match_flags)
{
    precise_unit bunit;
    // lets try checking for meter next which is one of the most common
    // reasons for getting here
    auto fnd = findWordOperatorSep(unit_string, "meter");
    if (fnd != std::string::npos) {
        std::string ustring = unit_string;
        ustring.erase(fnd, 5);
        bunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(bunit)) {
            return precise::m * bunit;
        }
    }

    // detect another somewhat common situation often amphour or ampsecond
    if (unit_string.compare(0, 3, "amp") == 0) {
        bunit = unit_from_string_internal(
            unit_string.substr(3), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::A * bunit;
        }
    }
    if (unit_string.front() == '%') {
        if ((match_flags & no_default_units) == 0) {
            bunit = default_unit(unit_string.substr(1));
            if (is_valid(bunit)) {
                return precise::percent * precise::pu * bunit;
            }
        }
        bunit = unit_from_string_internal(
            unit_string.substr(1), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
    }
    if (unit_string.compare(0, 2, "pu") == 0) {
        if ((match_flags & no_default_units) == 0) {
            bunit = default_unit(unit_string.substr(2));
            if (is_valid(bunit)) {
                return precise::pu * bunit;
            }
        }
        bunit = unit_from_string_internal(
            unit_string.substr(2), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
    }
    return precise::invalid;
}